

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O0

void __thiscall
wasm::MultiMemoryLowering::Replacer::visitMemoryGrow(Replacer *this,MemoryGrow *curr)

{
  initializer_list<wasm::Expression_*> __l;
  Name target;
  mapped_type *pmVar1;
  reference pvVar2;
  Call *expression;
  allocator<wasm::Expression_*> local_79;
  Expression *local_78;
  iterator local_70;
  size_type local_68;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_60;
  size_t local_48;
  char *pcStack_40;
  size_t sStack_38;
  Name funcName;
  mapped_type idx;
  MemoryGrow *curr_local;
  Replacer *this_local;
  
  pmVar1 = std::
           unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
           ::at(&this->parent->memoryIdxMap,&curr->memory);
  pvVar2 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::operator[]
                     (&this->parent->memoryGrowNames,(ulong)*pmVar1);
  local_48 = (pvVar2->super_IString).str._M_len;
  pcStack_40 = (pvVar2->super_IString).str._M_str;
  local_78 = curr->delta;
  local_70 = &local_78;
  local_68 = 1;
  sStack_38 = local_48;
  funcName.super_IString.str._M_len = (size_t)pcStack_40;
  std::allocator<wasm::Expression_*>::allocator(&local_79);
  __l._M_len = local_68;
  __l._M_array = local_70;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            (&local_60,__l,&local_79);
  target.super_IString.str._M_str = pcStack_40;
  target.super_IString.str._M_len = local_48;
  expression = Builder::makeCall(&this->builder,target,&local_60,
                                 (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)21>).
                                       super_Expression.type.id,false);
  Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
  ::replaceCurrent(&(this->
                    super_WalkerPass<wasm::PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>_>
                    ).
                    super_PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
                    .
                    super_Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
                   ,(Expression *)expression);
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector(&local_60);
  std::allocator<wasm::Expression_*>::~allocator(&local_79);
  return;
}

Assistant:

void visitMemoryGrow(MemoryGrow* curr) {
      auto idx = parent.memoryIdxMap.at(curr->memory);
      Name funcName = parent.memoryGrowNames[idx];
      replaceCurrent(builder.makeCall(funcName, {curr->delta}, curr->type));
    }